

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::SSBOArrayLengthTests::init(SSBOArrayLengthTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined4 uVar2;
  Context *pCVar3;
  long lVar4;
  long *plVar5;
  TestNode *node;
  long *plVar6;
  ulong *puVar7;
  long lVar8;
  string desc;
  string name;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  long local_48;
  char *local_40;
  char *local_38;
  
  lVar4 = 0;
  do {
    bVar1 = glcts::fixed_sample_locations_values[lVar4];
    local_38 = "unsized_";
    if (bVar1 != false) {
      local_38 = "sized_";
    }
    local_40 = "unsized ";
    if (bVar1 != false) {
      local_40 = "sized ";
    }
    lVar8 = 8;
    local_48 = lVar4;
    do {
      local_a0 = 0;
      local_98 = local_98 & 0xffffffffffffff00;
      local_a8 = &local_98;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_b8 = *plVar6;
        lStack_b0 = plVar5[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar6;
        local_c8 = (long *)*plVar5;
      }
      local_c0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8 = &local_d8;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_d8 = *plVar6;
        lStack_d0 = plVar5[3];
      }
      else {
        local_d8 = *plVar6;
        local_e8 = (long *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_88 = &local_78;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_78 = *plVar6;
        lStack_70 = plVar5[3];
      }
      else {
        local_78 = *plVar6;
        local_88 = (long *)*plVar5;
      }
      local_80 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Test length() of ","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar7) {
        local_98 = *puVar7;
        lStack_90 = plVar5[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *puVar7;
        local_a8 = (ulong *)*plVar5;
      }
      local_a0 = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_b8 = *plVar6;
        lStack_b0 = plVar5[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar6;
        local_c8 = (long *)*plVar5;
      }
      local_c0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8 = &local_d8;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_d8 = *plVar6;
        lStack_d0 = plVar5[3];
      }
      else {
        local_d8 = *plVar6;
        local_e8 = (long *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      node = (TestNode *)operator_new(0x90);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      uVar2 = *(undefined4 *)(&UNK_0219f6a8 + lVar8);
      tcu::TestCase::TestCase((TestCase *)node,pCVar3->m_testCtx,(char *)local_88,(char *)local_e8);
      node[1]._vptr_TestNode = (_func_int **)pCVar3;
      node->_vptr_TestNode = (_func_int **)&PTR__SSBOArrayLengthCase_0219f720;
      *(undefined4 *)&node[1].m_testCtx = uVar2;
      *(bool *)((long)&node[1].m_testCtx + 4) = bVar1;
      node[1].m_name._M_dataplus._M_p = (pointer)0x0;
      node[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild((TestNode *)this,node);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x50);
    lVar4 = local_48 + 1;
  } while (local_48 == 0);
  return (int)lVar4;
}

Assistant:

void SSBOArrayLengthTests::init (void)
{
	static const struct Qualifier
	{
		SSBOArrayLengthCase::ArrayAccess	access;
		const char*							name;
		const char*							desc;
	}  qualifiers[] =
	{
		{ SSBOArrayLengthCase::ACCESS_DEFAULT,		"",				""			},
		{ SSBOArrayLengthCase::ACCESS_WRITEONLY,	"writeonly_",	"writeonly"	},
		{ SSBOArrayLengthCase::ACCESS_READONLY,		"readonly_",	"readonly"	},
	};

	static const bool arraysSized[]	= { true, false };

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(arraysSized); ++sizeNdx)
	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		const std::string name = std::string() + ((arraysSized[sizeNdx]) ? ("sized_") : ("unsized_")) + qualifiers[qualifierNdx].name + "array";
		const std::string desc = std::string("Test length() of ") + ((arraysSized[sizeNdx]) ? ("sized ") : ("unsized ")) + qualifiers[qualifierNdx].name + " array";

		this->addChild(new SSBOArrayLengthCase(m_context, name.c_str(), desc.c_str(), qualifiers[qualifierNdx].access, arraysSized[sizeNdx]));
	}
}